

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dBox2dCollisionAlgorithm.cpp
# Opt level: O2

void b2CollidePolygons(btManifoldResult *manifold,btBox2dShape *polyA,btTransform *xfA,
                      btBox2dShape *polyB,btTransform *xfB)

{
  int iVar1;
  undefined8 uVar2;
  btTransform *pbVar3;
  btScalar bVar4;
  btScalar bVar5;
  btScalar bVar6;
  int iVar7;
  ulong uVar8;
  btScalar *pbVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  int *piVar13;
  btBox2dShape *pbVar14;
  btVector3 *pbVar15;
  ClipVertex *vOut;
  btScalar bVar16;
  btScalar bVar17;
  float fVar18;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  btVector3 bVar25;
  int edgeB;
  int edgeA;
  btVector3 sideNormal;
  ClipVertex incidentEdge [2];
  float local_208;
  float fStack_204;
  int local_1e0 [2];
  undefined1 local_1d8 [16];
  btVector3 local_1c8;
  undefined1 local_1b8 [16];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  btVector3 local_178;
  ClipVertex local_168;
  undefined8 local_154;
  undefined8 uStack_14c;
  ClipVertex local_138;
  undefined8 local_124;
  undefined8 uStack_11c;
  btVector3 local_108;
  btVector3 local_f8;
  btMatrix3x3 local_e8;
  btTransform local_b8;
  btTransform local_78;
  
  local_1e0[1] = 0;
  bVar16 = FindMaxSeparation(local_1e0 + 1,polyA,xfA,polyB,xfB);
  if (bVar16 <= 0.0) {
    local_1e0[0] = 0;
    bVar17 = FindMaxSeparation(local_1e0,polyB,xfB,polyA,xfA);
    if (bVar17 <= 0.0) {
      fVar19 = bVar16 * 0.98 + 0.001;
      pbVar14 = polyB;
      pbVar3 = xfA;
      if (bVar17 <= fVar19) {
        pbVar14 = polyA;
        pbVar3 = xfB;
        xfB = xfA;
        polyA = polyB;
      }
      local_78.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(xfB->m_basis).m_el[0].m_floats;
      local_78.m_basis.m_el[0].m_floats._8_8_ = *(undefined8 *)((xfB->m_basis).m_el[0].m_floats + 2)
      ;
      local_78.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(xfB->m_basis).m_el[1].m_floats;
      local_78.m_basis.m_el[1].m_floats._8_8_ = *(undefined8 *)((xfB->m_basis).m_el[1].m_floats + 2)
      ;
      local_78.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(xfB->m_basis).m_el[2].m_floats;
      local_78.m_basis.m_el[2].m_floats._8_8_ = *(undefined8 *)((xfB->m_basis).m_el[2].m_floats + 2)
      ;
      local_78.m_origin.m_floats._0_8_ = *(undefined8 *)(xfB->m_origin).m_floats;
      local_78.m_origin.m_floats._8_8_ = *(undefined8 *)((xfB->m_origin).m_floats + 2);
      local_b8.m_basis.m_el[0].m_floats._0_8_ = *(undefined8 *)(pbVar3->m_basis).m_el[0].m_floats;
      local_b8.m_basis.m_el[0].m_floats._8_8_ =
           *(undefined8 *)((pbVar3->m_basis).m_el[0].m_floats + 2);
      local_b8.m_basis.m_el[1].m_floats._0_8_ = *(undefined8 *)(pbVar3->m_basis).m_el[1].m_floats;
      local_b8.m_basis.m_el[1].m_floats._8_8_ =
           *(undefined8 *)((pbVar3->m_basis).m_el[1].m_floats + 2);
      local_b8.m_basis.m_el[2].m_floats._0_8_ = *(undefined8 *)(pbVar3->m_basis).m_el[2].m_floats;
      local_b8.m_basis.m_el[2].m_floats._8_8_ =
           *(undefined8 *)((pbVar3->m_basis).m_el[2].m_floats + 2);
      local_b8.m_origin.m_floats._0_8_ = *(undefined8 *)(pbVar3->m_origin).m_floats;
      local_b8.m_origin.m_floats._8_8_ = *(undefined8 *)((pbVar3->m_origin).m_floats + 2);
      piVar13 = local_1e0;
      if (bVar17 <= fVar19) {
        piVar13 = local_1e0 + 1;
      }
      iVar7 = *piVar13;
      btMatrix3x3::transpose(&local_e8,&local_b8.m_basis);
      local_168.v = operator*(&local_78.m_basis,pbVar14->m_normals + iVar7);
      bVar25 = operator*(&local_e8,&local_168.v);
      pbVar9 = polyA->m_normals[0].m_floats + 2;
      fVar22 = 1e+18;
      uVar8 = 0;
      for (uVar10 = 0; uVar10 != 4; uVar10 = uVar10 + 1) {
        fVar23 = *pbVar9 * bVar25.m_floats[2] +
                 ((btVector3 *)(pbVar9 + -2))->m_floats[0] * bVar25.m_floats[0] +
                 pbVar9[-1] * bVar25.m_floats[1];
        if (fVar23 < fVar22) {
          uVar8 = uVar10 & 0xffffffff;
          fVar22 = fVar23;
        }
        pbVar9 = pbVar9 + 4;
      }
      iVar1 = (int)uVar8;
      iVar12 = 0;
      if (iVar1 < 3) {
        iVar12 = iVar1 + 1;
      }
      local_e8.m_el[0] = btTransform::operator()(&local_b8,polyA->m_vertices + iVar1);
      local_e8.m_el._20_16_ = btTransform::operator()(&local_b8,polyA->m_vertices + iVar12);
      uVar2 = *(undefined8 *)pbVar14->m_vertices[iVar7].m_floats;
      pbVar15 = pbVar14->m_vertices;
      if (iVar7 < 3) {
        pbVar15 = pbVar14->m_vertices + (long)iVar7 + 1;
      }
      local_108.m_floats[2] = (btScalar)*(undefined8 *)(pbVar15->m_floats + 2);
      uVar20 = 0;
      uVar21 = 0;
      local_f8.m_floats[2] = (btScalar)*(undefined8 *)(pbVar14->m_vertices[iVar7].m_floats + 2);
      local_168.v.m_floats[1] =
           (float)((ulong)*(undefined8 *)pbVar15->m_floats >> 0x20) - (float)((ulong)uVar2 >> 0x20);
      local_168.v.m_floats[0] = (float)*(undefined8 *)pbVar15->m_floats - (float)uVar2;
      local_168.v.m_floats[2] = local_108.m_floats[2] - local_f8.m_floats[2];
      local_168.v.m_floats[3] = 0.0;
      local_108.m_floats = *&pbVar15->m_floats;
      local_f8.m_floats = *&pbVar14->m_vertices[iVar7].m_floats;
      local_178 = operator*(&local_78.m_basis,&local_168.v);
      btVector3::normalize(&local_178);
      local_1b8 = ZEXT416((uint)local_178.m_floats[0]);
      local_1d8 = ZEXT416((uint)local_178.m_floats[1]);
      local_f8 = btTransform::operator()(&local_78,&local_f8);
      local_108 = btTransform::operator()(&local_78,&local_108);
      bVar25.m_floats = local_178.m_floats;
      local_198._8_4_ = extraout_XMM0_Dc;
      local_198._0_8_ = local_108.m_floats._0_8_;
      local_198._12_4_ = extraout_XMM0_Dd;
      local_188._8_4_ = uVar20;
      local_188._0_8_ = local_108.m_floats._8_8_;
      local_188._12_4_ = uVar21;
      bVar4 = local_f8.m_floats[0];
      bVar5 = local_f8.m_floats[1];
      bVar6 = local_f8.m_floats[2];
      bVar16 = local_178.m_floats[2];
      local_168.v.m_floats = (btScalar  [4])ZEXT816(0);
      local_154 = 0;
      uStack_14c = 0;
      local_138.v.m_floats[0] = 0.0;
      local_138.v.m_floats[1] = 0.0;
      local_138.v.m_floats[2] = 0.0;
      local_138.v.m_floats[3] = 0.0;
      local_124 = 0;
      uStack_11c = 0;
      fVar23 = local_178.m_floats[0];
      fVar18 = local_178.m_floats[1];
      fVar22 = local_178.m_floats[2] * local_f8.m_floats[2];
      local_1a8._0_4_ = local_178.m_floats[0];
      local_1a8._4_4_ = local_178.m_floats[1];
      uStack_1a0 = 0;
      local_1c8.m_floats[2] = -local_178.m_floats[2];
      local_1c8.m_floats[0] = (btScalar)(int)(local_178.m_floats._0_8_ ^ 0x8000000080000000);
      local_1c8.m_floats[1] =
           (btScalar)(int)((local_178.m_floats._0_8_ ^ 0x8000000080000000) >> 0x20);
      local_1c8.m_floats[3] = 0.0;
      local_178.m_floats = bVar25.m_floats;
      iVar7 = ClipSegmentToLine(&local_168,(ClipVertex *)&local_e8,&local_1c8,
                                -(fVar22 + fVar23 * local_f8.m_floats[0] +
                                           fVar18 * local_f8.m_floats[1]));
      if (1 < iVar7) {
        vOut = &local_138;
        iVar7 = ClipSegmentToLine(vOut,&local_168,&local_178,
                                  bVar16 * (float)local_188._0_4_ +
                                  (float)local_1a8 * (float)local_198._0_4_ +
                                  local_1a8._4_4_ * (float)local_198._4_4_);
        if (1 < iVar7) {
          uVar20 = local_1b8._0_4_;
          fVar23 = -(float)local_1b8._0_4_;
          fVar18 = bVar5 * (float)local_1b8._0_4_;
          fVar24 = bVar4 * (float)local_1d8._0_4_;
          fVar22 = (float)local_1d8._0_4_;
          if (fVar19 < bVar17) {
            fVar22 = -(float)local_1d8._0_4_;
            fVar23 = (float)local_1b8._0_4_;
          }
          local_208 = -fVar22;
          fStack_204 = -fVar23;
          uVar8 = CONCAT44(fVar23,fVar22) ^ 0x8000000080000000;
          fVar22 = (float)local_1d8._0_4_;
          iVar7 = b2_maxManifoldPoints;
          for (lVar11 = 0; lVar11 < iVar7; lVar11 = lVar11 + 1) {
            if (((vOut->v).m_floats[2] * 0.0 +
                (vOut->v).m_floats[0] * fVar22 + (vOut->v).m_floats[1] * -(float)uVar20) -
                (bVar6 * 0.0 + (fVar24 - fVar18)) <= 0.0) {
              local_1c8.m_floats[1] = fStack_204;
              local_1c8.m_floats[0] = local_208;
              local_1c8.m_floats[2] = (btScalar)(-(uint)(bVar17 <= fVar19) & 0x80000000);
              local_1c8.m_floats[3] = 0.0;
              (*(manifold->super_Result)._vptr_Result[4])(manifold,&local_1c8,vOut);
              local_208 = (float)uVar8;
              fStack_204 = (float)(uVar8 >> 0x20);
              fVar22 = (float)local_1d8._0_4_;
              iVar7 = b2_maxManifoldPoints;
            }
            vOut = vOut + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void b2CollidePolygons(btManifoldResult* manifold,
					  const btBox2dShape* polyA, const btTransform& xfA,
					  const btBox2dShape* polyB, const btTransform& xfB)
{

	int edgeA = 0;
	btScalar separationA = FindMaxSeparation(&edgeA, polyA, xfA, polyB, xfB);
	if (separationA > 0.0f)
		return;

	int edgeB = 0;
	btScalar separationB = FindMaxSeparation(&edgeB, polyB, xfB, polyA, xfA);
	if (separationB > 0.0f)
		return;

	const btBox2dShape* poly1;	// reference poly
	const btBox2dShape* poly2;	// incident poly
	btTransform xf1, xf2;
	int edge1;		// reference edge
	unsigned char flip;
	const btScalar k_relativeTol = 0.98f;
	const btScalar k_absoluteTol = 0.001f;

	// TODO_ERIN use "radius" of poly for absolute tolerance.
	if (separationB > k_relativeTol * separationA + k_absoluteTol)
	{
		poly1 = polyB;
		poly2 = polyA;
		xf1 = xfB;
		xf2 = xfA;
		edge1 = edgeB;
		flip = 1;
	}
	else
	{
		poly1 = polyA;
		poly2 = polyB;
		xf1 = xfA;
		xf2 = xfB;
		edge1 = edgeA;
		flip = 0;
	}

	ClipVertex incidentEdge[2];
	FindIncidentEdge(incidentEdge, poly1, xf1, edge1, poly2, xf2);

	int count1 = poly1->getVertexCount();
	const btVector3* vertices1 = poly1->getVertices();

	btVector3 v11 = vertices1[edge1];
	btVector3 v12 = edge1 + 1 < count1 ? vertices1[edge1+1] : vertices1[0];

	//btVector3 dv = v12 - v11;
	btVector3 sideNormal = b2Mul(xf1.getBasis(), v12 - v11);
	sideNormal.normalize();
	btVector3 frontNormal = btCrossS(sideNormal, 1.0f);
	
	
	v11 = b2Mul(xf1, v11);
	v12 = b2Mul(xf1, v12);

	btScalar frontOffset = b2Dot(frontNormal, v11);
	btScalar sideOffset1 = -b2Dot(sideNormal, v11);
	btScalar sideOffset2 = b2Dot(sideNormal, v12);

	// Clip incident edge against extruded edge1 side edges.
	ClipVertex clipPoints1[2];
	clipPoints1[0].v.setValue(0,0,0);
	clipPoints1[1].v.setValue(0,0,0);

	ClipVertex clipPoints2[2];
	clipPoints2[0].v.setValue(0,0,0);
	clipPoints2[1].v.setValue(0,0,0);


	int np;

	// Clip to box side 1
	np = ClipSegmentToLine(clipPoints1, incidentEdge, -sideNormal, sideOffset1);

	if (np < 2)
		return;

	// Clip to negative box side 1
	np = ClipSegmentToLine(clipPoints2, clipPoints1,  sideNormal, sideOffset2);

	if (np < 2)
	{
		return;
	}

	// Now clipPoints2 contains the clipped points.
	btVector3 manifoldNormal = flip ? -frontNormal : frontNormal;

	int pointCount = 0;
	for (int i = 0; i < b2_maxManifoldPoints; ++i)
	{
		btScalar separation = b2Dot(frontNormal, clipPoints2[i].v) - frontOffset;

		if (separation <= 0.0f)
		{
			
			//b2ManifoldPoint* cp = manifold->points + pointCount;
			//btScalar separation = separation;
			//cp->localPoint1 = b2MulT(xfA, clipPoints2[i].v);
			//cp->localPoint2 = b2MulT(xfB, clipPoints2[i].v);

			manifold->addContactPoint(-manifoldNormal,clipPoints2[i].v,separation);

//			cp->id = clipPoints2[i].id;
//			cp->id.features.flip = flip;
			++pointCount;
		}
	}

//	manifold->pointCount = pointCount;}
}